

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O0

void __thiscall Pl_ASCIIHexDecoder::flush(Pl_ASCIIHexDecoder *this)

{
  Pipeline *pPVar1;
  char local_1d;
  int local_1c;
  int iStack_18;
  uchar ch;
  int i;
  int b [2];
  Pl_ASCIIHexDecoder *this_local;
  
  b = (int  [2])this;
  if (this->pos == 0) {
    QTC::TC("libtests","Pl_ASCIIHexDecoder no-op flush",0);
  }
  else {
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      if (this->inbuf[local_1c] < 'A') {
        *(int *)((long)&stack0xffffffffffffffe8 + (long)local_1c * 4) =
             this->inbuf[local_1c] + -0x30;
      }
      else {
        *(int *)((long)&stack0xffffffffffffffe8 + (long)local_1c * 4) =
             this->inbuf[local_1c] + -0x37;
      }
    }
    local_1d = (char)(iStack_18 << 4) + (char)i;
    QTC::TC("libtests","Pl_ASCIIHexDecoder partial flush",(uint)(this->pos != 2));
    this->pos = 0;
    this->inbuf[0] = '0';
    this->inbuf[1] = '0';
    this->inbuf[2] = '\0';
    pPVar1 = Pipeline::next(&this->super_Pipeline);
    (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_1d,1);
  }
  return;
}

Assistant:

void
Pl_ASCIIHexDecoder::flush()
{
    if (this->pos == 0) {
        QTC::TC("libtests", "Pl_ASCIIHexDecoder no-op flush");
        return;
    }
    int b[2];
    for (int i = 0; i < 2; ++i) {
        if (this->inbuf[i] >= 'A') {
            b[i] = this->inbuf[i] - 'A' + 10;
        } else {
            b[i] = this->inbuf[i] - '0';
        }
    }
    auto ch = static_cast<unsigned char>((b[0] << 4) + b[1]);

    QTC::TC("libtests", "Pl_ASCIIHexDecoder partial flush", (this->pos == 2) ? 0 : 1);
    // Reset before calling getNext()->write in case that throws an exception.
    this->pos = 0;
    this->inbuf[0] = '0';
    this->inbuf[1] = '0';
    this->inbuf[2] = '\0';

    next()->write(&ch, 1);
}